

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinproc.c
# Opt level: O2

void nn_cinproc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_sinproc *self_00;
  nn_list_item *it;
  ulong uVar1;
  char *pcVar2;
  int name;
  nn_ep *self_01;
  ulong uVar3;
  undefined8 uVar4;
  
  uVar3 = (ulong)(uint)src;
  if (*(int *)&self[1].fn == 2) {
    if (src == 1) {
      if (type != 6) {
        return;
      }
      self_01 = (nn_ep *)self[1].srcptr;
      name = 0xca;
LAB_0011deca:
      nn_ep_stat_increment(self_01,name,1);
      return;
    }
    if (src == 0x6c41) {
      if (type == 1) {
        self_00 = (nn_sinproc *)nn_alloc_(0x290);
        if (self_00 != (nn_sinproc *)0x0) {
          nn_sinproc_init(self_00,1,(nn_ep *)self[1].srcptr,self);
          it = nn_list_end((nn_list *)&self[1].ctx);
          nn_list_insert((nn_list *)&self[1].ctx,&self_00->item,it);
          nn_sinproc_accept(self_00,(nn_sinproc *)srcptr);
          nn_ep_stat_increment((nn_ep *)self[1].srcptr,0xca,-1);
          self_01 = (nn_ep *)self[1].srcptr;
          name = 0x65;
          goto LAB_0011deca;
        }
        nn_backtrace_print();
        fprintf(_stderr,"Out of memory (%s:%d)\n",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/cinproc.c"
                ,0xd7);
        goto LAB_0011df18;
      }
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected action";
      uVar3 = 0x6c41;
      uVar4 = 0xe3;
    }
    else {
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected source";
      uVar4 = 0xf0;
    }
  }
  else if (*(int *)&self[1].fn == 1) {
    if (src == -2) {
      if (type == -2) {
        *(undefined4 *)&self[1].fn = 2;
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected action";
      uVar3 = 0xfffffffffffffffe;
      uVar4 = 0xc5;
    }
    else {
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected source";
      uVar4 = 0xc9;
    }
  }
  else {
    nn_backtrace_print();
    uVar1 = (ulong)*(uint *)&self[1].fn;
    pcVar2 = "Unexpected state";
    uVar4 = 0xf7;
  }
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar2,uVar1,uVar3,(ulong)(uint)type,
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/cinproc.c"
          ,uVar4);
LAB_0011df18:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_cinproc_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_cinproc *cinproc;
    struct nn_sinproc *sinproc;
    struct nn_sinproc *peer;

    cinproc = nn_cont (self, struct nn_cinproc, fsm);


    switch (cinproc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_CINPROC_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                cinproc->state = NN_CINPROC_STATE_ACTIVE;
                return;
            default:
                nn_fsm_bad_action (cinproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (cinproc->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_CINPROC_STATE_ACTIVE:
        switch (src) {
        case NN_SINPROC_SRC_PEER:
            peer = (struct nn_sinproc*) srcptr;

            switch (type) {
            case NN_SINPROC_CONNECT:
                sinproc = nn_alloc (sizeof (struct nn_sinproc), "sinproc");
                alloc_assert (sinproc);
                nn_sinproc_init (sinproc, NN_CINPROC_SRC_SINPROC,
                    cinproc->item.ep, &cinproc->fsm);
                nn_list_insert (&cinproc->sinprocs, &sinproc->item,
                    nn_list_end (&cinproc->sinprocs));
                nn_sinproc_accept (sinproc, peer);
                nn_ep_stat_increment (cinproc->item.ep,
                    NN_STAT_INPROGRESS_CONNECTIONS, -1);
                nn_ep_stat_increment (cinproc->item.ep,
                    NN_STAT_ESTABLISHED_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (cinproc->state, src, type);
            }

        case NN_CINPROC_SRC_SINPROC:
            switch (type) {
            case NN_SINPROC_DISCONNECT:
                nn_ep_stat_increment (cinproc->item.ep,
                    NN_STAT_INPROGRESS_CONNECTIONS, 1);
                return;
            }
            return;

        default:
            nn_fsm_bad_source (cinproc->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (cinproc->state, src, type);
    }
}